

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmatrix.cpp
# Opt level: O1

VMatrix * __thiscall VMatrix::adjoint(VMatrix *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  VMatrix *in_RDI;
  
  fVar1 = this->m22;
  in_RDI->m11 = 1.0;
  in_RDI->m12 = 0.0;
  in_RDI->m13 = 0.0;
  in_RDI->m21 = 0.0;
  in_RDI->m22 = 1.0;
  in_RDI->m23 = 0.0;
  in_RDI->mtx = 0.0;
  in_RDI->mty = 0.0;
  in_RDI->m33 = 1.0;
  in_RDI->mType = None;
  in_RDI->dirty = None;
  fVar2 = this->m11;
  fVar3 = this->m12;
  fVar4 = this->m13;
  fVar5 = this->m21;
  fVar6 = this->m23;
  fVar7 = this->mtx;
  fVar8 = this->mty;
  fVar9 = this->m33;
  in_RDI->m11 = fVar1 * fVar9 - fVar8 * fVar6;
  in_RDI->m12 = fVar4 * fVar8 - fVar9 * fVar3;
  in_RDI->m13 = fVar3 * fVar6 - fVar1 * fVar4;
  in_RDI->m21 = fVar6 * fVar7 - fVar9 * fVar5;
  in_RDI->m22 = fVar7 * -fVar4 + fVar2 * fVar9;
  in_RDI->m23 = fVar6 * -fVar2 + fVar4 * fVar5;
  in_RDI->mtx = fVar7 * -fVar1 + fVar5 * fVar8;
  in_RDI->mty = fVar8 * -fVar2 + fVar3 * fVar7;
  in_RDI->m33 = fVar1 * fVar2 + -fVar3 * fVar5;
  in_RDI->mType = None;
  in_RDI->dirty = Project;
  return in_RDI;
}

Assistant:

VMatrix VMatrix::adjoint() const
{
    float h11, h12, h13, h21, h22, h23, h31, h32, h33;
    h11 = m22 * m33 - m23 * mty;
    h21 = m23 * mtx - m21 * m33;
    h31 = m21 * mty - m22 * mtx;
    h12 = m13 * mty - m12 * m33;
    h22 = m11 * m33 - m13 * mtx;
    h32 = m12 * mtx - m11 * mty;
    h13 = m12 * m23 - m13 * m22;
    h23 = m13 * m21 - m11 * m23;
    h33 = m11 * m22 - m12 * m21;

    VMatrix res;
    res.m11 = h11;
    res.m12 = h12;
    res.m13 = h13;
    res.m21 = h21;
    res.m22 = h22;
    res.m23 = h23;
    res.mtx = h31;
    res.mty = h32;
    res.m33 = h33;
    res.mType = MatrixType::None;
    res.dirty = MatrixType::Project;

    return res;
}